

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

int FindMaxBits_TargetCollisionNb(int nbHashes,int minCollisions)

{
  uint uVar1;
  uint nbBits;
  double dVar2;
  
  nbBits = 0x3f;
  while ((uVar1 = 2, 2 < nbBits &&
         (dVar2 = EstimateNbCollisions(nbHashes,nbBits), uVar1 = nbBits, dVar2 <= 20.0))) {
    nbBits = nbBits - 1;
  }
  return uVar1;
}

Assistant:

static int FindMaxBits_TargetCollisionNb(int nbHashes, int minCollisions)
{
    int nb;
    for (nb=63; nb>2; nb--) {
        double const nbColls = EstimateNbCollisions(nbHashes, nb);
        if (nbColls > minCollisions) return nb;
    }
    assert(0);
    return nb;
}